

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O1

bool __thiscall tinyusdz::Layer::check_unresolved_variant(Layer *this,uint32_t max_depth)

{
  bool bVar1;
  Layer LVar2;
  Layer *pLVar3;
  
  pLVar3 = this + 0x30;
  LVar2 = (Layer)0x0;
  do {
    pLVar3 = *(Layer **)pLVar3;
    if (pLVar3 == (Layer *)0x0) goto LAB_0013a8d2;
    bVar1 = anon_unknown_240::HasVariantRec(0,(PrimSpec *)(pLVar3 + 0x28),max_depth);
  } while (!bVar1);
  LVar2 = (Layer)0x1;
LAB_0013a8d2:
  this[0x15b3] = LVar2;
  return (bool)LVar2;
}

Assistant:

bool Layer::check_unresolved_variant(const uint32_t max_depth) const {
  bool ret = false;

  for (const auto &item : _prim_specs) {
    if (HasVariantRec(/* depth */ 0, item.second, max_depth)) {
      ret = true;
      break;
    }
  }

  _has_unresolved_variant = ret;
  return _has_unresolved_variant;
}